

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O3

int Wlc_NtkRemapLevels(Wlc_Ntk_t *p,Vec_Int_t *vObjs,int nLevels)

{
  Wlc_Obj_t *pWVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int *piVar6;
  int *piVar7;
  Wlc_Obj_t *pWVar8;
  void *__s;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  uint *local_40;
  void *local_38;
  
  uVar5 = nLevels + 1;
  uVar10 = 0x10;
  if (0xe < (uint)nLevels) {
    uVar10 = uVar5;
  }
  if (uVar10 == 0) {
    local_40 = (uint *)malloc(0x10);
    *local_40 = 0;
    local_40[2] = 0;
    local_40[3] = 0;
    local_40[1] = uVar5;
    local_38 = (void *)0x0;
    __s = (void *)0x0;
  }
  else {
    local_38 = malloc((long)(int)uVar10 << 2);
    if (local_38 != (void *)0x0) {
      memset(local_38,0,(long)(int)uVar5 * 4);
    }
    local_40 = (uint *)malloc(0x10);
    *local_40 = uVar10;
    __s = malloc((long)(int)uVar10 << 2);
    *(void **)(local_40 + 2) = __s;
    local_40[1] = uVar5;
    if (__s == (void *)0x0) {
      __s = (void *)0x0;
    }
    else {
      memset(__s,0,(long)(int)uVar5 << 2);
    }
  }
  if (nLevels < 0) {
LAB_00345d89:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  *(undefined4 *)((long)__s + (ulong)(uint)nLevels * 4) = 1;
  iVar12 = vObjs->nSize;
  if (0 < (long)iVar12) {
    piVar6 = vObjs->pArray;
    uVar13 = 0;
    do {
      iVar2 = piVar6[uVar13];
      lVar14 = (long)iVar2;
      if ((lVar14 < 0) || (iVar3 = (p->vLevels).nSize, iVar3 <= iVar2)) goto LAB_00345d6a;
      piVar7 = (p->vLevels).pArray;
      uVar10 = piVar7[lVar14];
      if ((uint)nLevels < uVar10) goto LAB_00345d89;
      *(undefined4 *)((long)__s + (ulong)uVar10 * 4) = 1;
      if ((iVar2 == 0) || (iVar4 = p->nObjsAlloc, iVar4 <= iVar2)) {
LAB_00345d4b:
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      pWVar8 = p->pObjs;
      pWVar1 = pWVar8 + lVar14;
      lVar11 = 0;
      while (lVar11 < (int)pWVar1->nFanins) {
        if ((2 < pWVar1->nFanins) ||
           (paVar9 = &pWVar8[lVar14].field_10, (*(uint *)pWVar1 & 0x3f | 0x10) == 0x16)) {
          paVar9 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pWVar1->field_10).pFanins[0];
        }
        uVar10 = paVar9->Fanins[lVar11];
        if ((ulong)uVar10 != 0) {
          if (((int)uVar10 < 0) || (iVar3 <= (int)uVar10)) goto LAB_00345d6a;
          uVar10 = piVar7[uVar10];
          if ((uint)nLevels < uVar10) goto LAB_00345d89;
          *(undefined4 *)((long)__s + (ulong)uVar10 * 4) = 1;
        }
        lVar11 = lVar11 + 1;
        if (iVar4 <= iVar2) goto LAB_00345d4b;
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < (ulong)(long)iVar12);
  }
  uVar13 = 0;
  iVar12 = 0;
  do {
    if (*(int *)((long)__s + uVar13 * 4) != 0) {
      if (uVar5 <= uVar13) goto LAB_00345d89;
      *(int *)((long)local_38 + uVar13 * 4) = iVar12;
      iVar12 = iVar12 + 1;
    }
    uVar13 = uVar13 + 1;
    if (uVar5 == uVar13) {
      if (0 < (p->vLevels).nSize) {
        piVar6 = (p->vLevels).pArray;
        lVar14 = 0;
        do {
          uVar5 = piVar6[lVar14];
          if ((uint)nLevels < uVar5) {
LAB_00345d6a:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          if (*(int *)((long)__s + (ulong)uVar5 * 4) == 0) {
            iVar12 = -1;
          }
          else {
            iVar12 = *(int *)((long)local_38 + (ulong)uVar5 * 4);
          }
          piVar6[lVar14] = iVar12;
          lVar14 = lVar14 + 1;
        } while (lVar14 < (p->vLevels).nSize);
      }
      iVar12 = *(int *)((long)local_38 + (ulong)(uint)nLevels * 4);
      free(__s);
      free(local_40);
      free(local_38);
      return iVar12;
    }
  } while( true );
}

Assistant:

int Wlc_NtkRemapLevels( Wlc_Ntk_t * p, Vec_Int_t * vObjs, int nLevels )
{
    int i, k, iFanin, iObj, Entry, Level = 0, Res = nLevels;
    Vec_Int_t * vMap  = Vec_IntStart( nLevels+1 );
    Vec_Int_t * vUsed = Vec_IntStart( nLevels+1 );
    // mark used levels
    Vec_IntWriteEntry( vUsed, nLevels, 1 );
    Vec_IntForEachEntry( vObjs, iObj, i )
    {
        Vec_IntWriteEntry( vUsed, Wlc_ObjLevelId(p, iObj), 1 );
        Wlc_ObjForEachFanin( Wlc_NtkObj(p, iObj), iFanin, k ) if ( iFanin )
            Vec_IntWriteEntry( vUsed, Wlc_ObjLevelId(p, iFanin), 1 );
    }
    // create level map
    Vec_IntForEachEntry( vUsed, Entry, i )
        if ( Entry )
            Vec_IntWriteEntry( vMap, i, Level++ );
    //printf( "Total used levels %d -> %d\n", nLevels, Level );
    // remap levels
    Vec_IntForEachEntry( &p->vLevels, Level, i )
    {
        if ( Vec_IntEntry(vUsed, Level) )
            Vec_IntWriteEntry( &p->vLevels, i, Vec_IntEntry(vMap, Level) );
        else
            Vec_IntWriteEntry( &p->vLevels, i, -1 );
    }
    Res = Vec_IntEntry( vMap, nLevels );
    Vec_IntFree( vUsed );
    Vec_IntFree( vMap );
    return Res;
}